

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O1

void __thiscall
ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*>::
set<std::initializer_list<wasm::Expression*>>
          (ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*> *this,
          initializer_list<wasm::Expression_*> *list)

{
  ulong uVar1;
  size_type sVar2;
  iterator ppEVar3;
  void *pvVar4;
  long lVar5;
  initializer_list<wasm::Expression_*> *__range2;
  
  uVar1 = list->_M_len;
  if (*(ulong *)(this + 0x10) < uVar1) {
    *(ulong *)(this + 0x10) = uVar1;
    pvVar4 = MixedArena::allocSpace(*(MixedArena **)(this + 0x18),uVar1 * 8,8);
    *(void **)this = pvVar4;
  }
  sVar2 = list->_M_len;
  if (sVar2 != 0) {
    ppEVar3 = list->_M_array;
    lVar5 = 0;
    do {
      *(undefined8 *)(*(long *)this + lVar5) = *(undefined8 *)((long)ppEVar3 + lVar5);
      lVar5 = lVar5 + 8;
    } while (sVar2 << 3 != lVar5);
  }
  *(ulong *)(this + 8) = uVar1;
  return;
}

Assistant:

void set(const ListType& list) {
    size_t size = list.size();
    if (allocatedElements < size) {
      static_cast<SubType*>(this)->allocate(size);
    }
    size_t i = 0;
    for (auto elem : list) {
      data[i++] = elem;
    }
    usedElements = size;
  }